

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.c
# Opt level: O2

char * flag_string(flag_type *flag_table,long *bits)

{
  ulong uVar1;
  char *pcVar2;
  bool bVar3;
  size_t sVar4;
  flag_type *pfVar5;
  double dVar6;
  
  flag_string::buf[0] = '\0';
  pfVar5 = flag_table;
  do {
    if (pfVar5->name == (char *)0x0) {
LAB_003a8963:
      pcVar2 = flag_string::buf;
      if (flag_string::buf[0] == '\0') {
        pcVar2 = " none";
      }
      return pcVar2 + 1;
    }
    bVar3 = is_stat(flag_table);
    if (bVar3) {
LAB_003a891c:
      uVar1 = bits[(int)(pfVar5->bit / 0x20)];
      dVar6 = exp2((double)(pfVar5->bit % 0x20));
      if ((uVar1 & (long)dVar6) != 0) {
        sVar4 = strlen(flag_string::buf);
        (flag_string::buf + sVar4)[0] = ' ';
        (flag_string::buf + sVar4)[1] = '\0';
        strcat(flag_string::buf,pfVar5->name);
        goto LAB_003a8963;
      }
    }
    else {
      uVar1 = bits[(int)(pfVar5->bit / 0x20)];
      dVar6 = exp2((double)(pfVar5->bit % 0x20));
      if ((uVar1 & (long)dVar6) == 0) goto LAB_003a891c;
      sVar4 = strlen(flag_string::buf);
      (flag_string::buf + sVar4)[0] = ' ';
      (flag_string::buf + sVar4)[1] = '\0';
      strcat(flag_string::buf,pfVar5->name);
    }
    pfVar5 = pfVar5 + 1;
  } while( true );
}

Assistant:

char *flag_string(const struct flag_type *flag_table, long bits[])
{
	static char buf[512];
	int flag;

	buf[0] = '\0';

	for (flag = 0; flag_table[flag].name != nullptr; flag++)
	{
		if (!is_stat(flag_table) && IS_SET(bits, flag_table[flag].bit))
		{
			strcat(buf, " ");
			strcat(buf, flag_table[flag].name);
		}
		else if (IS_SET(bits, flag_table[flag].bit))
		{
			strcat(buf, " ");
			strcat(buf, flag_table[flag].name);
			break;
		}
	}

	return (buf[0] != '\0') ? buf + 1 : (char *)"none";
}